

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O0

int AF_A_LeafSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint uVar1;
  int iVar2;
  AActor *this;
  bool bVar3;
  PClassActor *local_98;
  bool local_8e;
  bool local_8b;
  DVector3 local_88;
  double local_70;
  double zo;
  double yo;
  double xo;
  AActor *pAStack_50;
  int i;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_8b = true;
    if (stateowner != (AActor *)0x0) {
      local_8b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_8b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                      ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_8e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_8e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_8e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                      ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                      ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    uVar1 = FRandom::operator()(&pr_leaf);
    for (xo._4_4_ = (uVar1 & 3) + 1; xo._4_4_ != 0; xo._4_4_ = xo._4_4_ + -1) {
      iVar2 = FRandom::Random2(&pr_leaf);
      yo = (double)iVar2 / 4.0;
      iVar2 = FRandom::Random2(&pr_leaf);
      zo = (double)iVar2 / 4.0;
      iVar2 = FRandom::operator()(&pr_leaf);
      local_70 = (double)iVar2 / 4.0;
      uVar1 = FRandom::operator()(&pr_leaf);
      if ((uVar1 & 1) == 0) {
        local_98 = PClass::FindActor("Leaf2");
      }
      else {
        local_98 = PClass::FindActor("Leaf1");
      }
      AActor::Vec3Offset(&local_88,stateowner,yo,zo,local_70,false);
      this = Spawn(local_98,&local_88,ALLOW_REPLACE);
      pAStack_50 = this;
      if (this != (AActor *)0x0) {
        iVar2 = FRandom::operator()(&pr_leaf);
        AActor::Thrust(this,(double)iVar2 / 128.0 + 3.0);
        TObjPtr<AActor>::operator=(&pAStack_50->target,stateowner);
        pAStack_50->special1 = 0;
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafSpawn)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = (pr_leaf()&3)+1; i; i--)
	{
		double xo = pr_leaf.Random2() / 4.;
		double yo = pr_leaf.Random2() / 4.;
		double zo = pr_leaf() / 4.;
		mo = Spawn (pr_leaf()&1 ? PClass::FindActor ("Leaf1") : PClass::FindActor ("Leaf2"),
			self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Thrust(pr_leaf() / 128. + 3);
			mo->target = self;
			mo->special1 = 0;
		}
	}
	return 0;
}